

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O1

uint aom_variance64x16_sse2(uint8_t *src,int src_stride,uint8_t *ref,int ref_stride,uint *sse)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  unkuint9 Var58;
  undefined1 auVar59 [11];
  undefined1 auVar60 [15];
  unkuint9 Var61;
  undefined1 auVar62 [11];
  undefined1 auVar63 [15];
  undefined1 auVar64 [11];
  undefined1 auVar65 [15];
  undefined1 auVar66 [11];
  undefined1 auVar67 [15];
  undefined1 auVar68 [11];
  undefined1 auVar69 [15];
  undefined1 auVar70 [11];
  undefined1 auVar71 [15];
  undefined1 auVar72 [11];
  undefined1 auVar73 [15];
  undefined1 auVar74 [11];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  long lVar91;
  undefined1 (*pauVar92) [16];
  int iVar93;
  undefined1 (*pauVar94) [16];
  undefined1 auVar95 [12];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  short sVar99;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  short sVar108;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  short sVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  int iVar112;
  int iVar115;
  int iVar116;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  int iVar117;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  
  pauVar94 = (undefined1 (*) [16])(src + 0x30);
  pauVar92 = (undefined1 (*) [16])(ref + 0x30);
  iVar112 = 0;
  iVar115 = 0;
  iVar116 = 0;
  iVar117 = 0;
  iVar93 = 0x10;
  sVar99 = 0;
  sVar103 = 0;
  sVar104 = 0;
  sVar105 = 0;
  sVar106 = 0;
  sVar107 = 0;
  sVar108 = 0;
  sVar109 = 0;
  do {
    auVar96 = pauVar94[-3];
    auVar97 = pauVar94[-2];
    auVar98 = pauVar94[-1];
    auVar1[0xd] = 0;
    auVar1._0_13_ = auVar96._0_13_;
    auVar1[0xe] = auVar96[7];
    auVar9[0xc] = auVar96[6];
    auVar9._0_12_ = auVar96._0_12_;
    auVar9._13_2_ = auVar1._13_2_;
    auVar17[0xb] = 0;
    auVar17._0_11_ = auVar96._0_11_;
    auVar17._12_3_ = auVar9._12_3_;
    auVar25[10] = auVar96[5];
    auVar25._0_10_ = auVar96._0_10_;
    auVar25._11_4_ = auVar17._11_4_;
    auVar33[9] = 0;
    auVar33._0_9_ = auVar96._0_9_;
    auVar33._10_5_ = auVar25._10_5_;
    auVar41[8] = auVar96[4];
    auVar41._0_8_ = auVar96._0_8_;
    auVar41._9_6_ = auVar33._9_6_;
    auVar57._7_8_ = 0;
    auVar57._0_7_ = auVar41._8_7_;
    Var58 = CONCAT81(SUB158(auVar57 << 0x40,7),auVar96[3]);
    auVar75._9_6_ = 0;
    auVar75._0_9_ = Var58;
    auVar59._1_10_ = SUB1510(auVar75 << 0x30,5);
    auVar59[0] = auVar96[2];
    auVar76._11_4_ = 0;
    auVar76._0_11_ = auVar59;
    auVar49[2] = auVar96[1];
    auVar49._0_2_ = auVar96._0_2_;
    auVar49._3_12_ = SUB1512(auVar76 << 0x20,3);
    auVar100 = pauVar92[-3];
    auVar2[0xd] = 0;
    auVar2._0_13_ = auVar100._0_13_;
    auVar2[0xe] = auVar100[7];
    auVar10[0xc] = auVar100[6];
    auVar10._0_12_ = auVar100._0_12_;
    auVar10._13_2_ = auVar2._13_2_;
    auVar18[0xb] = 0;
    auVar18._0_11_ = auVar100._0_11_;
    auVar18._12_3_ = auVar10._12_3_;
    auVar26[10] = auVar100[5];
    auVar26._0_10_ = auVar100._0_10_;
    auVar26._11_4_ = auVar18._11_4_;
    auVar34[9] = 0;
    auVar34._0_9_ = auVar100._0_9_;
    auVar34._10_5_ = auVar26._10_5_;
    auVar42[8] = auVar100[4];
    auVar42._0_8_ = auVar100._0_8_;
    auVar42._9_6_ = auVar34._9_6_;
    auVar60._7_8_ = 0;
    auVar60._0_7_ = auVar42._8_7_;
    Var61 = CONCAT81(SUB158(auVar60 << 0x40,7),auVar100[3]);
    auVar77._9_6_ = 0;
    auVar77._0_9_ = Var61;
    auVar62._1_10_ = SUB1510(auVar77 << 0x30,5);
    auVar62[0] = auVar100[2];
    auVar78._11_4_ = 0;
    auVar78._0_11_ = auVar62;
    auVar50[2] = auVar100[1];
    auVar50._0_2_ = auVar100._0_2_;
    auVar50._3_12_ = SUB1512(auVar78 << 0x20,3);
    auVar118._0_2_ = (auVar96._0_2_ & 0xff) - (auVar100._0_2_ & 0xff);
    auVar118._2_2_ = auVar49._2_2_ - auVar50._2_2_;
    auVar118._4_2_ = auVar59._0_2_ - auVar62._0_2_;
    auVar118._6_2_ = (short)Var58 - (short)Var61;
    auVar118._8_2_ = auVar41._8_2_ - auVar42._8_2_;
    auVar118._10_2_ = auVar25._10_2_ - auVar26._10_2_;
    auVar118._12_2_ = auVar9._12_2_ - auVar10._12_2_;
    auVar118._14_2_ = (auVar1._13_2_ >> 8) - (auVar2._13_2_ >> 8);
    auVar120 = pmaddwd(auVar118,auVar118);
    auVar111 = *pauVar94;
    auVar101 = pauVar92[-2];
    auVar102 = pauVar92[-1];
    auVar114 = *pauVar92;
    auVar110._0_2_ = (ushort)auVar96[8] - (ushort)auVar100[8];
    auVar110._2_2_ = (ushort)auVar96[9] - (ushort)auVar100[9];
    auVar110._4_2_ = (ushort)auVar96[10] - (ushort)auVar100[10];
    auVar110._6_2_ = (ushort)auVar96[0xb] - (ushort)auVar100[0xb];
    auVar110._8_2_ = (ushort)auVar96[0xc] - (ushort)auVar100[0xc];
    auVar110._10_2_ = (ushort)auVar96[0xd] - (ushort)auVar100[0xd];
    auVar110._12_2_ = (ushort)auVar96[0xe] - (ushort)auVar100[0xe];
    auVar110._14_2_ = (ushort)auVar96[0xf] - (ushort)auVar100[0xf];
    auVar123 = pmaddwd(auVar110,auVar110);
    auVar3[0xd] = 0;
    auVar3._0_13_ = auVar97._0_13_;
    auVar3[0xe] = auVar97[7];
    auVar11[0xc] = auVar97[6];
    auVar11._0_12_ = auVar97._0_12_;
    auVar11._13_2_ = auVar3._13_2_;
    auVar19[0xb] = 0;
    auVar19._0_11_ = auVar97._0_11_;
    auVar19._12_3_ = auVar11._12_3_;
    auVar27[10] = auVar97[5];
    auVar27._0_10_ = auVar97._0_10_;
    auVar27._11_4_ = auVar19._11_4_;
    auVar35[9] = 0;
    auVar35._0_9_ = auVar97._0_9_;
    auVar35._10_5_ = auVar27._10_5_;
    auVar43[8] = auVar97[4];
    auVar43._0_8_ = auVar97._0_8_;
    auVar43._9_6_ = auVar35._9_6_;
    auVar63._7_8_ = 0;
    auVar63._0_7_ = auVar43._8_7_;
    Var58 = CONCAT81(SUB158(auVar63 << 0x40,7),auVar97[3]);
    auVar79._9_6_ = 0;
    auVar79._0_9_ = Var58;
    auVar64._1_10_ = SUB1510(auVar79 << 0x30,5);
    auVar64[0] = auVar97[2];
    auVar80._11_4_ = 0;
    auVar80._0_11_ = auVar64;
    auVar51[2] = auVar97[1];
    auVar51._0_2_ = auVar97._0_2_;
    auVar51._3_12_ = SUB1512(auVar80 << 0x20,3);
    auVar4[0xd] = 0;
    auVar4._0_13_ = auVar101._0_13_;
    auVar4[0xe] = auVar101[7];
    auVar12[0xc] = auVar101[6];
    auVar12._0_12_ = auVar101._0_12_;
    auVar12._13_2_ = auVar4._13_2_;
    auVar20[0xb] = 0;
    auVar20._0_11_ = auVar101._0_11_;
    auVar20._12_3_ = auVar12._12_3_;
    auVar28[10] = auVar101[5];
    auVar28._0_10_ = auVar101._0_10_;
    auVar28._11_4_ = auVar20._11_4_;
    auVar36[9] = 0;
    auVar36._0_9_ = auVar101._0_9_;
    auVar36._10_5_ = auVar28._10_5_;
    auVar44[8] = auVar101[4];
    auVar44._0_8_ = auVar101._0_8_;
    auVar44._9_6_ = auVar36._9_6_;
    auVar65._7_8_ = 0;
    auVar65._0_7_ = auVar44._8_7_;
    Var61 = CONCAT81(SUB158(auVar65 << 0x40,7),auVar101[3]);
    auVar81._9_6_ = 0;
    auVar81._0_9_ = Var61;
    auVar66._1_10_ = SUB1510(auVar81 << 0x30,5);
    auVar66[0] = auVar101[2];
    auVar82._11_4_ = 0;
    auVar82._0_11_ = auVar66;
    auVar52[2] = auVar101[1];
    auVar52._0_2_ = auVar101._0_2_;
    auVar52._3_12_ = SUB1512(auVar82 << 0x20,3);
    auVar100._0_2_ = (auVar97._0_2_ & 0xff) - (auVar101._0_2_ & 0xff);
    auVar100._2_2_ = auVar51._2_2_ - auVar52._2_2_;
    auVar100._4_2_ = auVar64._0_2_ - auVar66._0_2_;
    auVar100._6_2_ = (short)Var58 - (short)Var61;
    auVar100._8_2_ = auVar43._8_2_ - auVar44._8_2_;
    auVar100._10_2_ = auVar27._10_2_ - auVar28._10_2_;
    auVar100._12_2_ = auVar11._12_2_ - auVar12._12_2_;
    auVar100._14_2_ = (auVar3._13_2_ >> 8) - (auVar4._13_2_ >> 8);
    auVar96._0_2_ = (ushort)auVar97[8] - (ushort)auVar101[8];
    auVar96._2_2_ = (ushort)auVar97[9] - (ushort)auVar101[9];
    auVar96._4_2_ = (ushort)auVar97[10] - (ushort)auVar101[10];
    auVar96._6_2_ = (ushort)auVar97[0xb] - (ushort)auVar101[0xb];
    auVar96._8_2_ = (ushort)auVar97[0xc] - (ushort)auVar101[0xc];
    auVar96._10_2_ = (ushort)auVar97[0xd] - (ushort)auVar101[0xd];
    auVar96._12_2_ = (ushort)auVar97[0xe] - (ushort)auVar101[0xe];
    auVar96._14_2_ = (ushort)auVar97[0xf] - (ushort)auVar101[0xf];
    auVar101 = pmaddwd(auVar100,auVar100);
    auVar119 = pmaddwd(auVar96,auVar96);
    auVar5[0xd] = 0;
    auVar5._0_13_ = auVar98._0_13_;
    auVar5[0xe] = auVar98[7];
    auVar13[0xc] = auVar98[6];
    auVar13._0_12_ = auVar98._0_12_;
    auVar13._13_2_ = auVar5._13_2_;
    auVar21[0xb] = 0;
    auVar21._0_11_ = auVar98._0_11_;
    auVar21._12_3_ = auVar13._12_3_;
    auVar29[10] = auVar98[5];
    auVar29._0_10_ = auVar98._0_10_;
    auVar29._11_4_ = auVar21._11_4_;
    auVar37[9] = 0;
    auVar37._0_9_ = auVar98._0_9_;
    auVar37._10_5_ = auVar29._10_5_;
    auVar45[8] = auVar98[4];
    auVar45._0_8_ = auVar98._0_8_;
    auVar45._9_6_ = auVar37._9_6_;
    auVar67._7_8_ = 0;
    auVar67._0_7_ = auVar45._8_7_;
    Var58 = CONCAT81(SUB158(auVar67 << 0x40,7),auVar98[3]);
    auVar83._9_6_ = 0;
    auVar83._0_9_ = Var58;
    auVar68._1_10_ = SUB1510(auVar83 << 0x30,5);
    auVar68[0] = auVar98[2];
    auVar84._11_4_ = 0;
    auVar84._0_11_ = auVar68;
    auVar53[2] = auVar98[1];
    auVar53._0_2_ = auVar98._0_2_;
    auVar53._3_12_ = SUB1512(auVar84 << 0x20,3);
    auVar6[0xd] = 0;
    auVar6._0_13_ = auVar102._0_13_;
    auVar6[0xe] = auVar102[7];
    auVar14[0xc] = auVar102[6];
    auVar14._0_12_ = auVar102._0_12_;
    auVar14._13_2_ = auVar6._13_2_;
    auVar22[0xb] = 0;
    auVar22._0_11_ = auVar102._0_11_;
    auVar22._12_3_ = auVar14._12_3_;
    auVar30[10] = auVar102[5];
    auVar30._0_10_ = auVar102._0_10_;
    auVar30._11_4_ = auVar22._11_4_;
    auVar38[9] = 0;
    auVar38._0_9_ = auVar102._0_9_;
    auVar38._10_5_ = auVar30._10_5_;
    auVar46[8] = auVar102[4];
    auVar46._0_8_ = auVar102._0_8_;
    auVar46._9_6_ = auVar38._9_6_;
    auVar69._7_8_ = 0;
    auVar69._0_7_ = auVar46._8_7_;
    Var61 = CONCAT81(SUB158(auVar69 << 0x40,7),auVar102[3]);
    auVar85._9_6_ = 0;
    auVar85._0_9_ = Var61;
    auVar70._1_10_ = SUB1510(auVar85 << 0x30,5);
    auVar70[0] = auVar102[2];
    auVar86._11_4_ = 0;
    auVar86._0_11_ = auVar70;
    auVar54[2] = auVar102[1];
    auVar54._0_2_ = auVar102._0_2_;
    auVar54._3_12_ = SUB1512(auVar86 << 0x20,3);
    auVar121._0_2_ = (auVar98._0_2_ & 0xff) - (auVar102._0_2_ & 0xff);
    auVar121._2_2_ = auVar53._2_2_ - auVar54._2_2_;
    auVar121._4_2_ = auVar68._0_2_ - auVar70._0_2_;
    auVar121._6_2_ = (short)Var58 - (short)Var61;
    auVar121._8_2_ = auVar45._8_2_ - auVar46._8_2_;
    auVar121._10_2_ = auVar29._10_2_ - auVar30._10_2_;
    auVar121._12_2_ = auVar13._12_2_ - auVar14._12_2_;
    auVar121._14_2_ = (auVar5._13_2_ >> 8) - (auVar6._13_2_ >> 8);
    auVar97._0_2_ = (ushort)auVar98[8] - (ushort)auVar102[8];
    auVar97._2_2_ = (ushort)auVar98[9] - (ushort)auVar102[9];
    auVar97._4_2_ = (ushort)auVar98[10] - (ushort)auVar102[10];
    auVar97._6_2_ = (ushort)auVar98[0xb] - (ushort)auVar102[0xb];
    auVar97._8_2_ = (ushort)auVar98[0xc] - (ushort)auVar102[0xc];
    auVar97._10_2_ = (ushort)auVar98[0xd] - (ushort)auVar102[0xd];
    auVar97._12_2_ = (ushort)auVar98[0xe] - (ushort)auVar102[0xe];
    auVar97._14_2_ = (ushort)auVar98[0xf] - (ushort)auVar102[0xf];
    auVar122 = pmaddwd(auVar121,auVar121);
    auVar98 = pmaddwd(auVar97,auVar97);
    auVar7[0xd] = 0;
    auVar7._0_13_ = auVar111._0_13_;
    auVar7[0xe] = auVar111[7];
    auVar15[0xc] = auVar111[6];
    auVar15._0_12_ = auVar111._0_12_;
    auVar15._13_2_ = auVar7._13_2_;
    auVar23[0xb] = 0;
    auVar23._0_11_ = auVar111._0_11_;
    auVar23._12_3_ = auVar15._12_3_;
    auVar31[10] = auVar111[5];
    auVar31._0_10_ = auVar111._0_10_;
    auVar31._11_4_ = auVar23._11_4_;
    auVar39[9] = 0;
    auVar39._0_9_ = auVar111._0_9_;
    auVar39._10_5_ = auVar31._10_5_;
    auVar47[8] = auVar111[4];
    auVar47._0_8_ = auVar111._0_8_;
    auVar47._9_6_ = auVar39._9_6_;
    auVar71._7_8_ = 0;
    auVar71._0_7_ = auVar47._8_7_;
    Var58 = CONCAT81(SUB158(auVar71 << 0x40,7),auVar111[3]);
    auVar87._9_6_ = 0;
    auVar87._0_9_ = Var58;
    auVar72._1_10_ = SUB1510(auVar87 << 0x30,5);
    auVar72[0] = auVar111[2];
    auVar88._11_4_ = 0;
    auVar88._0_11_ = auVar72;
    auVar55[2] = auVar111[1];
    auVar55._0_2_ = auVar111._0_2_;
    auVar55._3_12_ = SUB1512(auVar88 << 0x20,3);
    auVar8[0xd] = 0;
    auVar8._0_13_ = auVar114._0_13_;
    auVar8[0xe] = auVar114[7];
    auVar16[0xc] = auVar114[6];
    auVar16._0_12_ = auVar114._0_12_;
    auVar16._13_2_ = auVar8._13_2_;
    auVar24[0xb] = 0;
    auVar24._0_11_ = auVar114._0_11_;
    auVar24._12_3_ = auVar16._12_3_;
    auVar32[10] = auVar114[5];
    auVar32._0_10_ = auVar114._0_10_;
    auVar32._11_4_ = auVar24._11_4_;
    auVar40[9] = 0;
    auVar40._0_9_ = auVar114._0_9_;
    auVar40._10_5_ = auVar32._10_5_;
    auVar48[8] = auVar114[4];
    auVar48._0_8_ = auVar114._0_8_;
    auVar48._9_6_ = auVar40._9_6_;
    auVar73._7_8_ = 0;
    auVar73._0_7_ = auVar48._8_7_;
    Var61 = CONCAT81(SUB158(auVar73 << 0x40,7),auVar114[3]);
    auVar89._9_6_ = 0;
    auVar89._0_9_ = Var61;
    auVar74._1_10_ = SUB1510(auVar89 << 0x30,5);
    auVar74[0] = auVar114[2];
    auVar90._11_4_ = 0;
    auVar90._0_11_ = auVar74;
    auVar56[2] = auVar114[1];
    auVar56._0_2_ = auVar114._0_2_;
    auVar56._3_12_ = SUB1512(auVar90 << 0x20,3);
    auVar102._0_2_ = (auVar111._0_2_ & 0xff) - (auVar114._0_2_ & 0xff);
    auVar102._2_2_ = auVar55._2_2_ - auVar56._2_2_;
    auVar102._4_2_ = auVar72._0_2_ - auVar74._0_2_;
    auVar102._6_2_ = (short)Var58 - (short)Var61;
    auVar102._8_2_ = auVar47._8_2_ - auVar48._8_2_;
    auVar102._10_2_ = auVar31._10_2_ - auVar32._10_2_;
    auVar102._12_2_ = auVar15._12_2_ - auVar16._12_2_;
    auVar102._14_2_ = (auVar7._13_2_ >> 8) - (auVar8._13_2_ >> 8);
    auVar113._0_2_ = (ushort)auVar111[8] - (ushort)auVar114[8];
    auVar113._2_2_ = (ushort)auVar111[9] - (ushort)auVar114[9];
    auVar113._4_2_ = (ushort)auVar111[10] - (ushort)auVar114[10];
    auVar113._6_2_ = (ushort)auVar111[0xb] - (ushort)auVar114[0xb];
    auVar113._8_2_ = (ushort)auVar111[0xc] - (ushort)auVar114[0xc];
    auVar113._10_2_ = (ushort)auVar111[0xd] - (ushort)auVar114[0xd];
    auVar113._12_2_ = (ushort)auVar111[0xe] - (ushort)auVar114[0xe];
    auVar113._14_2_ = (ushort)auVar111[0xf] - (ushort)auVar114[0xf];
    auVar111 = pmaddwd(auVar102,auVar102);
    auVar114 = pmaddwd(auVar113,auVar113);
    iVar112 = auVar114._0_4_ + auVar111._0_4_ +
              auVar98._0_4_ + auVar122._0_4_ + auVar119._0_4_ +
              auVar101._0_4_ + auVar123._0_4_ + auVar120._0_4_ + iVar112;
    iVar115 = auVar114._4_4_ + auVar111._4_4_ +
              auVar98._4_4_ + auVar122._4_4_ + auVar119._4_4_ +
              auVar101._4_4_ + auVar123._4_4_ + auVar120._4_4_ + iVar115;
    iVar116 = auVar114._8_4_ + auVar111._8_4_ +
              auVar98._8_4_ + auVar122._8_4_ + auVar119._8_4_ +
              auVar101._8_4_ + auVar123._8_4_ + auVar120._8_4_ + iVar116;
    iVar117 = auVar114._12_4_ + auVar111._12_4_ +
              auVar98._12_4_ + auVar122._12_4_ + auVar119._12_4_ +
              auVar101._12_4_ + auVar123._12_4_ + auVar120._12_4_ + iVar117;
    sVar99 = auVar102._0_2_ + auVar113._0_2_ +
             auVar96._0_2_ + auVar121._0_2_ + auVar97._0_2_ +
             auVar110._0_2_ + auVar100._0_2_ + auVar118._0_2_ + sVar99;
    sVar103 = auVar102._2_2_ + auVar113._2_2_ +
              auVar96._2_2_ + auVar121._2_2_ + auVar97._2_2_ +
              auVar110._2_2_ + auVar100._2_2_ + auVar118._2_2_ + sVar103;
    sVar104 = auVar102._4_2_ + auVar113._4_2_ +
              auVar96._4_2_ + auVar121._4_2_ + auVar97._4_2_ +
              auVar110._4_2_ + auVar100._4_2_ + auVar118._4_2_ + sVar104;
    sVar105 = auVar102._6_2_ + auVar113._6_2_ +
              auVar96._6_2_ + auVar121._6_2_ + auVar97._6_2_ +
              auVar110._6_2_ + auVar100._6_2_ + auVar118._6_2_ + sVar105;
    sVar106 = auVar102._8_2_ + auVar113._8_2_ +
              auVar96._8_2_ + auVar121._8_2_ + auVar97._8_2_ +
              auVar110._8_2_ + auVar100._8_2_ + auVar118._8_2_ + sVar106;
    sVar107 = auVar102._10_2_ + auVar113._10_2_ +
              auVar96._10_2_ + auVar121._10_2_ + auVar97._10_2_ +
              auVar110._10_2_ + auVar100._10_2_ + auVar118._10_2_ + sVar107;
    sVar108 = auVar102._12_2_ + auVar113._12_2_ +
              auVar96._12_2_ + auVar121._12_2_ + auVar97._12_2_ +
              auVar110._12_2_ + auVar100._12_2_ + auVar118._12_2_ + sVar108;
    sVar109 = auVar102._14_2_ + auVar113._14_2_ +
              auVar96._14_2_ + auVar121._14_2_ + auVar97._14_2_ +
              auVar110._14_2_ + auVar100._14_2_ + auVar118._14_2_ + sVar109;
    pauVar94 = (undefined1 (*) [16])(*pauVar94 + src_stride);
    pauVar92 = (undefined1 (*) [16])(*pauVar92 + ref_stride);
    iVar93 = iVar93 + -1;
  } while (iVar93 != 0);
  auVar98._0_4_ = iVar116 + iVar112;
  iVar117 = iVar117 + iVar115;
  auVar95._0_8_ = CONCAT44(iVar117,auVar98._0_4_);
  auVar95._8_4_ = iVar116;
  *sse = iVar117 + auVar98._0_4_;
  auVar114._12_2_ = (short)((uint)iVar117 >> 0x10);
  auVar114._0_12_ = auVar95;
  auVar114._14_2_ = sVar105;
  auVar101._12_4_ = auVar114._12_4_;
  auVar101._0_10_ = auVar95._0_10_;
  auVar101._10_2_ = sVar104;
  auVar111._10_6_ = auVar101._10_6_;
  auVar111._8_2_ = (short)iVar117;
  auVar111._0_8_ = auVar95._0_8_;
  auVar98._8_8_ = auVar111._8_8_;
  auVar98._6_2_ = sVar103;
  auVar98._4_2_ = (short)((uint)auVar98._0_4_ >> 0x10);
  lVar91 = (long)((int)sVar109 + (auVar101._12_4_ >> 0x10) + (int)sVar107 + (auVar98._4_4_ >> 0x10)
                 + (int)sVar108 + (auVar111._8_4_ >> 0x10) + (int)sVar106 + (int)sVar99);
  return (iVar117 + auVar98._0_4_) - (int)((ulong)(lVar91 * lVar91) >> 10);
}

Assistant:

unsigned int aom_mse8x8_sse2(const uint8_t *src, int src_stride,
                             const uint8_t *ref, int ref_stride,
                             unsigned int *sse) {
  aom_variance8x8_sse2(src, src_stride, ref, ref_stride, sse);
  return *sse;
}